

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO2Quad<double>::GradientsReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO2Quad<double> *this,
          MatrixXd *refcoords)

{
  Index IVar1;
  Scalar *dataPtr;
  ulong cols;
  CoeffReturnType piVar2;
  RowXpr local_878;
  RowXpr local_828;
  RowXpr local_7f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_7b8;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_740;
  RowXpr local_6c8;
  RowXpr local_678;
  RowXpr local_640;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_608;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_590;
  int local_518;
  int i;
  MatrixXd local_4d8;
  Matrix<double,__1,__1,_0,__1,__1> local_4c0;
  NestedExpressionType local_4a8;
  undefined1 local_4a0 [8];
  Array<double,__1,__1,_0,__1,__1> segment_x1_grad;
  ConstRowXpr local_480;
  MatrixXd local_448;
  Matrix<double,__1,__1,_0,__1,__1> local_430;
  NestedExpressionType local_418;
  undefined1 local_410 [8];
  Array<double,__1,__1,_0,__1,__1> segment_x0_grad;
  ConstRowXpr local_3f0;
  MatrixXd local_3b8;
  Matrix<double,__1,__1,_0,__1,__1> local_3a0;
  NestedExpressionType local_388;
  undefined1 local_380 [8];
  Array<double,__1,__1,_0,__1,__1> segment_x1_eval;
  ConstRowXpr local_360;
  MatrixXd local_328;
  Matrix<double,__1,__1,_0,__1,__1> local_310;
  NestedExpressionType local_2f8;
  undefined1 local_2f0 [8];
  Array<double,__1,__1,_0,__1,__1> segment_x0_eval;
  undefined1 local_2d0 [8];
  Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> temp;
  int local_2a8;
  byte local_2a1;
  uint local_2a0;
  allocator<char> local_299;
  size_type n_pts;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *refcoords_local;
  FeLagrangeO2Quad<double> *this_local;
  Matrix<double,__1,__1,_0,__1,__1> *result;
  
  local_20 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)refcoords;
  refcoords_local = (MatrixXd *)this;
  this_local = (FeLagrangeO2Quad<double> *)__return_storage_ptr__;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 != 2) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Reference coordinates must be 2-vectors");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"refcoords.rows() == 2",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x32f,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_pts,"",&local_299);
    lf::base::AssertionFailed(&local_248,&local_270,0x32f,(string *)&n_pts);
    std::__cxx11::string::~string((string *)&n_pts);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  local_2a0 = (uint)IVar1;
  local_2a1 = 0;
  local_2a8 = 9;
  temp._28_4_ = local_2a0 * 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_2a8,
             (uint *)&temp.field_0x1c);
  dataPtr = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                       __return_storage_ptr__,0,0);
  cols = (ulong)local_2a0;
  Eigen::Stride<0,_0>::Stride
            ((Stride<0,_0> *)
             ((long)&segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_cols + 6));
  Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_2d0,
             dataPtr,0x12,cols,
             (Stride<0,_0> *)
             ((long)&segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_cols + 6));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_360,local_20,0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_328,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_360);
  FeLagrangeO2Segment<double>::EvalReferenceShapeFunctions
            (&local_310,(FeLagrangeO2Segment<double> *)&krsf_segment_,&local_328);
  local_2f8 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_310);
  Eigen::Array<double,-1,-1,0,-1,-1>::
  Array<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Array<double,_1,_1,0,_1,_1> *)local_2f0,&local_2f8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_310);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_328);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_3f0,local_20,1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_3b8,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_3f0);
  FeLagrangeO2Segment<double>::EvalReferenceShapeFunctions
            (&local_3a0,(FeLagrangeO2Segment<double> *)&krsf_segment_,&local_3b8);
  local_388 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_3a0);
  Eigen::Array<double,-1,-1,0,-1,-1>::
  Array<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Array<double,_1,_1,0,_1,_1> *)local_380,&local_388);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_3a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_3b8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_480,local_20,0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_448,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_480);
  FeLagrangeO2Segment<double>::GradientsReferenceShapeFunctions
            (&local_430,(FeLagrangeO2Segment<double> *)&krsf_segment_,&local_448);
  local_418 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_430);
  Eigen::Array<double,-1,-1,0,-1,-1>::
  Array<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Array<double,_1,_1,0,_1,_1> *)local_410,&local_418);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_430);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_448);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row((ConstRowXpr *)&i,local_20,1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_4d8,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&i);
  FeLagrangeO2Segment<double>::GradientsReferenceShapeFunctions
            (&local_4c0,(FeLagrangeO2Segment<double> *)&krsf_segment_,&local_4d8);
  local_4a8 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4c0);
  Eigen::Array<double,-1,-1,0,-1,-1>::
  Array<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Array<double,_1,_1,0,_1,_1> *)local_4a0,&local_4a8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_4c0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_4d8);
  for (local_518 = 0; local_518 < 9; local_518 = local_518 + 1) {
    piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        ksegment_to_quad_mapping_,(long)local_518,0);
    Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_640,(DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_410,
               (long)*piVar2);
    piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        ksegment_to_quad_mapping_,(long)local_518,1);
    Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_678,(DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_380,
               (long)*piVar2);
    Eigen::ArrayBase<Eigen::Block<Eigen::Array<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
              (&local_608,
               (ArrayBase<Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>> *)&local_640,
               (ArrayBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               &local_678);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::matrix(&local_590,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_608);
    Eigen::DenseBase<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::row(&local_6c8,
          (DenseBase<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
           *)local_2d0,(long)local_518);
    Eigen::Block<Eigen::Map<Eigen::Array<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,1,-1,false>::
    operator=((Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>
               *)&local_6c8,
              (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
               *)&local_590);
    piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        ksegment_to_quad_mapping_,(long)local_518,1);
    Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_7f0,(DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_4a0,
               (long)*piVar2);
    piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        ksegment_to_quad_mapping_,(long)local_518,0);
    Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_828,(DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_2f0,
               (long)*piVar2);
    Eigen::ArrayBase<Eigen::Block<Eigen::Array<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
              (&local_7b8,
               (ArrayBase<Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>> *)&local_7f0,
               (ArrayBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               &local_828);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::matrix(&local_740,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_7b8);
    Eigen::DenseBase<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::row(&local_878,
          (DenseBase<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
           *)local_2d0,(long)(local_518 + 9));
    Eigen::Block<Eigen::Map<Eigen::Array<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,1,-1,false>::
    operator=((Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>
               *)&local_878,
              (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
               *)&local_740);
  }
  local_2a1 = 1;
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_4a0);
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_410);
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_380);
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_2f0);
  if ((local_2a1 & 1) == 0) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  GradientsReferenceShapeFunctions(
      const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");

    const size_type n_pts(refcoords.cols());
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(9, 2 * n_pts);

    // reshape into a 18xn_pts matrix.
    Eigen::Map<Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic>,
               Eigen::AutoAlign>
        temp(&result(0, 0), 18, n_pts);

    // evaluate "segment" shape functions (b^j and b^l)
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x0_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(0))).array();
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x1_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(1))).array();

    // evaluate derivatives of "segment" shape functions (b^j and
    // b^l)
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x0_grad =
        (krsf_segment_.GradientsReferenceShapeFunctions(refcoords.row(0)))
            .array();
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x1_grad =
        (krsf_segment_.GradientsReferenceShapeFunctions(refcoords.row(1)))
            .array();

    // evaluate gradients  using the product rule and
    // the tensor product structure of the basis functions.
    for (int i = 0; i < 9; ++i) {
      // d/dx
      temp.row(i) = (segment_x0_grad.row(ksegment_to_quad_mapping_(i, 0)) *
                     segment_x1_eval.row(ksegment_to_quad_mapping_(i, 1)))
                        .matrix();
      // d/dy
      temp.row(i + 9) = (segment_x1_grad.row(ksegment_to_quad_mapping_(i, 1)) *
                         segment_x0_eval.row(ksegment_to_quad_mapping_(i, 0)))
                            .matrix();
    }
    return result;
  }